

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfactoryloader.cpp
# Opt level: O0

MetaDataList * __thiscall QFactoryLoader::metaData(QFactoryLoader *this)

{
  QLatin1StringView s;
  QByteArrayView input;
  bool bVar1;
  undefined1 uVar2;
  byte bVar3;
  Private *pPVar4;
  Private *pPVar5;
  QPluginParsedMetaData *this_00;
  Private *this_01;
  qsizetype sz;
  const_iterator o;
  QStaticPlugin *this_02;
  Private *in_RSI;
  MetaDataList *in_RDI;
  long in_FS_OFFSET;
  QStaticPlugin *plugin;
  QList<QStaticPlugin> *__range1_1;
  unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter> *library;
  vector<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>
  *__range1;
  QList<QPluginParsedMetaData> *metaData;
  QByteArrayView pluginData;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  QList<QStaticPlugin> staticPlugins;
  QLatin1StringView iid;
  const_iterator __end1;
  const_iterator __begin1;
  QPluginParsedMetaData parsed;
  QMutexLocker<QMutex> locker;
  QCborValue *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe64;
  byte in_stack_fffffffffffffe65;
  byte in_stack_fffffffffffffe66;
  undefined1 in_stack_fffffffffffffe67;
  undefined7 in_stack_fffffffffffffe70;
  MetaDataList *pMVar6;
  const_iterator local_b0;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  undefined1 *local_98;
  QLatin1String local_88;
  unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter> *local_78;
  __normal_iterator<const_std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_*,_std::vector<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>_>
  local_70 [7];
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QPluginParsedMetaData *)&DAT_aaaaaaaaaaaaaaaa;
  pMVar6 = in_RDI;
  QList<QPluginParsedMetaData>::QList((QList<QPluginParsedMetaData> *)0x443ecb);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  Private::operator->(in_RSI);
  QMutexLocker<QMutex>::QMutexLocker
            ((QMutexLocker<QMutex> *)
             CONCAT17(in_stack_fffffffffffffe67,
                      CONCAT16(in_stack_fffffffffffffe66,
                               CONCAT15(in_stack_fffffffffffffe65,
                                        CONCAT14(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60
                                                )))),(QMutex *)in_stack_fffffffffffffe58);
  pPVar4 = Private::operator->(in_RSI);
  local_70[0]._M_current =
       (unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter> *)&DAT_aaaaaaaaaaaaaaaa;
  local_70[0]._M_current =
       (unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter> *)
       std::
       vector<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>
       ::begin((vector<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>
                *)CONCAT17(in_stack_fffffffffffffe67,
                           CONCAT16(in_stack_fffffffffffffe66,
                                    CONCAT15(in_stack_fffffffffffffe65,
                                             CONCAT14(in_stack_fffffffffffffe64,
                                                      in_stack_fffffffffffffe60)))));
  local_78 = (unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter> *)&DAT_aaaaaaaaaaaaaaaa;
  local_78 = (unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter> *)
             std::
             vector<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>
             ::end((vector<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>
                    *)CONCAT17(in_stack_fffffffffffffe67,
                               CONCAT16(in_stack_fffffffffffffe66,
                                        CONCAT15(in_stack_fffffffffffffe65,
                                                 CONCAT14(in_stack_fffffffffffffe64,
                                                          in_stack_fffffffffffffe60)))));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_*,_std::vector<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>_>
                             *)CONCAT17(in_stack_fffffffffffffe67,
                                        CONCAT16(in_stack_fffffffffffffe66,
                                                 CONCAT15(in_stack_fffffffffffffe65,
                                                          CONCAT14(in_stack_fffffffffffffe64,
                                                                   in_stack_fffffffffffffe60)))),
                            (__normal_iterator<const_std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_*,_std::vector<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>_>
                             *)in_stack_fffffffffffffe58), bVar1) {
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_*,_std::vector<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>_>
    ::operator*(local_70);
    std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>::operator->
              ((unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter> *)0x443fc8);
    QList<QPluginParsedMetaData>::append
              ((QList<QPluginParsedMetaData> *)
               CONCAT17(in_stack_fffffffffffffe67,
                        CONCAT16(in_stack_fffffffffffffe66,
                                 CONCAT15(in_stack_fffffffffffffe65,
                                          CONCAT14(in_stack_fffffffffffffe64,
                                                   in_stack_fffffffffffffe60)))),
               (parameter_type)in_stack_fffffffffffffe58);
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_*,_std::vector<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>_>
    ::operator++(local_70);
  }
  local_88.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_88.m_data = &DAT_aaaaaaaaaaaaaaaa;
  pPVar5 = Private::operator->(in_RSI);
  this_00 = (QPluginParsedMetaData *)QByteArray::constData((QByteArray *)0x444050);
  this_01 = Private::operator->(in_RSI);
  sz = QByteArray::size(&this_01->iid);
  QLatin1String::QLatin1String(&local_88,(char *)this_00,sz);
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  local_a8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
  QPluginLoader::staticPlugins();
  local_b0.i = (QStaticPlugin *)&DAT_aaaaaaaaaaaaaaaa;
  local_b0 = QList<QStaticPlugin>::begin
                       ((QList<QStaticPlugin> *)
                        CONCAT17(in_stack_fffffffffffffe67,
                                 CONCAT16(in_stack_fffffffffffffe66,
                                          CONCAT15(in_stack_fffffffffffffe65,
                                                   CONCAT14(in_stack_fffffffffffffe64,
                                                            in_stack_fffffffffffffe60)))));
  o = QList<QStaticPlugin>::end
                ((QList<QStaticPlugin> *)
                 CONCAT17(in_stack_fffffffffffffe67,
                          CONCAT16(in_stack_fffffffffffffe66,
                                   CONCAT15(in_stack_fffffffffffffe65,
                                            CONCAT14(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60)))));
  while (uVar2 = QList<QStaticPlugin>::const_iterator::operator!=(&local_b0,o), (bool)uVar2) {
    this_02 = QList<QStaticPlugin>::const_iterator::operator*(&local_b0);
    QByteArrayView::QByteArrayView<char,_true>
              ((QByteArrayView *)CONCAT17(uVar2,in_stack_fffffffffffffe70),(char *)this_02,
               CONCAT17(in_stack_fffffffffffffe67,
                        CONCAT16(in_stack_fffffffffffffe66,
                                 CONCAT15(in_stack_fffffffffffffe65,
                                          CONCAT14(in_stack_fffffffffffffe64,
                                                   in_stack_fffffffffffffe60)))));
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    input.m_data = (storage_type *)pMVar6;
    input.m_size = (qsizetype)pPVar4;
    QPluginParsedMetaData::QPluginParsedMetaData(this_00,input);
    in_stack_fffffffffffffe67 = QPluginParsedMetaData::isError((QPluginParsedMetaData *)0x44420a);
    in_stack_fffffffffffffe66 = 1;
    bVar3 = in_stack_fffffffffffffe66;
    if (!(bool)in_stack_fffffffffffffe67) {
      QPluginParsedMetaData::value
                ((QPluginParsedMetaData *)this_02,
                 CONCAT13(in_stack_fffffffffffffe67,
                          CONCAT12(1,CONCAT11(in_stack_fffffffffffffe65,in_stack_fffffffffffffe64)))
                );
      s.m_data = (char *)pPVar5;
      s.m_size = (qsizetype)this_01;
      ::QCborValue::QCborValue((QCborValue *)this_02,s);
      bVar3 = ::operator!=((QCborValue *)
                           CONCAT17(in_stack_fffffffffffffe67,
                                    CONCAT16(in_stack_fffffffffffffe66,
                                             CONCAT15(in_stack_fffffffffffffe65,
                                                      CONCAT14(in_stack_fffffffffffffe64,
                                                               in_stack_fffffffffffffe60)))),
                           in_stack_fffffffffffffe58);
      in_stack_fffffffffffffe66 = bVar3;
      ::QCborValue::~QCborValue
                ((QCborValue *)
                 CONCAT17(in_stack_fffffffffffffe67,
                          CONCAT16(bVar3,CONCAT15(bVar3,CONCAT14(in_stack_fffffffffffffe64,
                                                                 in_stack_fffffffffffffe60)))));
      ::QCborValue::~QCborValue
                ((QCborValue *)
                 CONCAT17(in_stack_fffffffffffffe67,
                          CONCAT16(in_stack_fffffffffffffe66,
                                   CONCAT15(bVar3,CONCAT14(in_stack_fffffffffffffe64,
                                                           in_stack_fffffffffffffe60)))));
    }
    in_stack_fffffffffffffe65 = bVar3;
    if ((in_stack_fffffffffffffe65 & 1) == 0) {
      QList<QPluginParsedMetaData>::append
                ((QList<QPluginParsedMetaData> *)
                 CONCAT17(in_stack_fffffffffffffe67,
                          CONCAT16(in_stack_fffffffffffffe66,
                                   CONCAT15(in_stack_fffffffffffffe65,
                                            CONCAT14(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60)))),
                 (rvalue_ref)in_stack_fffffffffffffe58);
    }
    QPluginParsedMetaData::~QPluginParsedMetaData((QPluginParsedMetaData *)0x44436a);
    QList<QStaticPlugin>::const_iterator::operator++(&local_b0);
  }
  QList<QStaticPlugin>::~QList((QList<QStaticPlugin> *)0x4443b8);
  QMutexLocker<QMutex>::~QMutexLocker
            ((QMutexLocker<QMutex> *)
             CONCAT17(in_stack_fffffffffffffe67,
                      CONCAT16(in_stack_fffffffffffffe66,
                               CONCAT15(in_stack_fffffffffffffe65,
                                        CONCAT14(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60
                                                )))));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QFactoryLoader::MetaDataList QFactoryLoader::metaData() const
{
    QList<QPluginParsedMetaData> metaData;
#if QT_CONFIG(library)
    QMutexLocker locker(&d->mutex);
    for (const auto &library : d->libraries)
        metaData.append(library->metaData);
#endif

    QLatin1StringView iid(d->iid.constData(), d->iid.size());
    const auto staticPlugins = QPluginLoader::staticPlugins();
    for (const QStaticPlugin &plugin : staticPlugins) {
        QByteArrayView pluginData(static_cast<const char *>(plugin.rawMetaData), plugin.rawMetaDataSize);
        QPluginParsedMetaData parsed(pluginData);
        if (parsed.isError() || parsed.value(QtPluginMetaDataKeys::IID) != iid)
            continue;
        metaData.append(std::move(parsed));
    }

    // other portions of the code will cast to int (e.g., keyMap())
    Q_ASSERT(metaData.size() <= std::numeric_limits<int>::max());
    return metaData;
}